

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Mapping.c
# Opt level: O1

void X86_get_insn_id(cs_struct *h,cs_insn *insn,uint id)

{
  uint8_t *puVar1;
  cs_mode cVar2;
  undefined8 uVar3;
  uint8_t uVar4;
  unsigned_short uVar5;
  uint uVar6;
  cs_detail *pcVar7;
  ulong uVar8;
  
  uVar5 = insn_find(insns,0x1726,id,&h->insn_cache);
  if (uVar5 == 0) {
    return;
  }
  insn->id = (uint)insns[uVar5].mapid;
  if (h->detail == CS_OPT_OFF) {
    return;
  }
  pcVar7 = insn->detail;
  *(undefined4 *)(pcVar7->regs_read + 8) = *(undefined4 *)(insns[uVar5].regs_use + 8);
  *(undefined8 *)pcVar7->regs_read = *(undefined8 *)insns[uVar5].regs_use;
  uVar6 = count_positive(insns[uVar5].regs_use);
  pcVar7 = insn->detail;
  pcVar7->regs_read_count = (uint8_t)uVar6;
  if (id == 0x935) {
    if (h->mode == CS_MODE_64) {
LAB_001aa399:
      *(undefined4 *)(pcVar7->regs_write + 0x10) = *(undefined4 *)(insns[uVar5].regs_mod + 0x10);
      uVar3 = *(undefined8 *)(insns[uVar5].regs_mod + 8);
      *(undefined8 *)pcVar7->regs_write = *(undefined8 *)insns[uVar5].regs_mod;
      *(undefined8 *)(pcVar7->regs_write + 8) = uVar3;
      goto LAB_001aa3c2;
    }
    pcVar7->regs_write[0] = '\x13';
    insn->detail->regs_write[1] = '\x18';
    uVar4 = '\x02';
  }
  else if (id == 0x936) {
    if (h->mode == CS_MODE_64) goto LAB_001aa399;
    pcVar7->regs_write[0] = '\x13';
    insn->detail->regs_write[1] = '\x16';
    insn->detail->regs_write[2] = '\x18';
    uVar4 = '\x03';
  }
  else {
    *(undefined4 *)(pcVar7->regs_write + 0x10) = *(undefined4 *)(insns[uVar5].regs_mod + 0x10);
    uVar3 = *(undefined8 *)(insns[uVar5].regs_mod + 8);
    *(undefined8 *)pcVar7->regs_write = *(undefined8 *)insns[uVar5].regs_mod;
    *(undefined8 *)(pcVar7->regs_write + 8) = uVar3;
LAB_001aa3c2:
    uVar6 = count_positive(insns[uVar5].regs_mod);
    uVar4 = (uint8_t)uVar6;
  }
  insn->detail->regs_write_count = uVar4;
  uVar6 = insn->id;
  if ((int)uVar6 < 0x1cf) {
    if ((4 < uVar6 - 0x60) || (uVar6 - 0x60 == 3)) {
      if (uVar6 - 0x148 < 4) {
        if (h->mode == CS_MODE_64) {
          pcVar7 = insn->detail;
          if ((ulong)pcVar7->regs_read_count != 0) {
            uVar8 = 0;
            do {
              if (pcVar7->regs_read[uVar8] == '\x1d') {
                pcVar7->regs_read[uVar8] = '+';
                break;
              }
              uVar8 = uVar8 + 1;
            } while (pcVar7->regs_read_count != uVar8);
          }
          pcVar7 = insn->detail;
          if ((ulong)pcVar7->regs_write_count != 0) {
            uVar8 = 0;
            do {
              if (pcVar7->regs_write[uVar8] == '\x1d') goto LAB_001aa7d5;
              uVar8 = uVar8 + 1;
            } while (pcVar7->regs_write_count != uVar8);
          }
        }
        else if (h->mode == CS_MODE_16) {
          pcVar7 = insn->detail;
          if ((ulong)pcVar7->regs_read_count != 0) {
            uVar8 = 0;
            do {
              if (pcVar7->regs_read[uVar8] == '\x1d') {
                pcVar7->regs_read[uVar8] = '-';
                break;
              }
              uVar8 = uVar8 + 1;
            } while (pcVar7->regs_read_count != uVar8);
          }
          pcVar7 = insn->detail;
          if ((ulong)pcVar7->regs_write_count != 0) {
            uVar8 = 0;
            do {
              if (pcVar7->regs_write[uVar8] == '\x1d') goto LAB_001aa7a7;
              uVar8 = uVar8 + 1;
            } while (pcVar7->regs_write_count != uVar8);
          }
        }
        goto LAB_001aa7da;
      }
      if (2 < uVar6 - 0x14c) goto LAB_001aa7da;
      cVar2 = h->mode;
      if (cVar2 == CS_MODE_16) {
        uVar4 = '\f';
LAB_001aa6d1:
        insn->detail->regs_read[0] = uVar4;
        pcVar7 = insn->detail;
        pcVar7->regs_read_count = '\x01';
        pcVar7->regs_write[0] = uVar4;
        insn->detail->regs_write_count = '\x01';
      }
      else {
        if (cVar2 == CS_MODE_64) {
          uVar4 = '&';
          goto LAB_001aa6d1;
        }
        if (cVar2 == CS_MODE_32) {
          uVar4 = '\x16';
          goto LAB_001aa6d1;
        }
      }
      if (insn->id != 0x14c) {
        insn->detail->regs_read[1] = '\x19';
        insn->detail->regs_read_count = '\x02';
      }
      goto LAB_001aa7da;
    }
  }
  else {
    if ((uVar6 - 0x266 < 0x39) && ((0x1e000000000000dU >> ((ulong)(uVar6 - 0x266) & 0x3f) & 1) != 0)
       ) {
      if (h->mode == CS_MODE_64) {
        pcVar7 = insn->detail;
        if ((ulong)pcVar7->regs_read_count != 0) {
          uVar8 = 0;
          do {
            if (pcVar7->regs_read[uVar8] == '\x17') {
              pcVar7->regs_read[uVar8] = '\'';
              break;
            }
            uVar8 = uVar8 + 1;
          } while (pcVar7->regs_read_count != uVar8);
        }
        pcVar7 = insn->detail;
        if ((ulong)pcVar7->regs_write_count != 0) {
          uVar8 = 0;
          do {
            if (pcVar7->regs_write[uVar8] == '\x17') {
              pcVar7->regs_write[uVar8] = '\'';
              break;
            }
            uVar8 = uVar8 + 1;
          } while (pcVar7->regs_write_count != uVar8);
        }
      }
      else if (h->mode == CS_MODE_16) {
        pcVar7 = insn->detail;
        if ((ulong)pcVar7->regs_read_count != 0) {
          uVar8 = 0;
          do {
            if (pcVar7->regs_read[uVar8] == '\x17') {
              pcVar7->regs_read[uVar8] = '\x0e';
              break;
            }
            uVar8 = uVar8 + 1;
          } while (pcVar7->regs_read_count != uVar8);
        }
        pcVar7 = insn->detail;
        if ((ulong)pcVar7->regs_write_count != 0) {
          uVar8 = 0;
          do {
            if (pcVar7->regs_write[uVar8] == '\x17') {
              pcVar7->regs_write[uVar8] = '\x0e';
              break;
            }
            uVar8 = uVar8 + 1;
          } while (pcVar7->regs_write_count != uVar8);
        }
      }
      goto LAB_001aa7da;
    }
    if ((6 < uVar6 - 0x1cf) || ((0x53U >> (uVar6 - 0x1cf & 0x1f) & 1) == 0)) goto LAB_001aa7da;
  }
  if (h->mode == CS_MODE_64) {
    pcVar7 = insn->detail;
    if ((ulong)pcVar7->regs_read_count != 0) {
      uVar8 = 0;
      do {
        if (pcVar7->regs_read[uVar8] == '\x17') {
          pcVar7->regs_read[uVar8] = '\'';
          break;
        }
        uVar8 = uVar8 + 1;
      } while (pcVar7->regs_read_count != uVar8);
    }
    pcVar7 = insn->detail;
    if ((ulong)pcVar7->regs_write_count != 0) {
      uVar8 = 0;
      do {
        if (pcVar7->regs_write[uVar8] == '\x17') {
          pcVar7->regs_write[uVar8] = '\'';
          break;
        }
        uVar8 = uVar8 + 1;
      } while (pcVar7->regs_write_count != uVar8);
    }
    pcVar7 = insn->detail;
    if ((ulong)pcVar7->regs_read_count != 0) {
      uVar8 = 0;
      do {
        if (pcVar7->regs_read[uVar8] == '\x1d') {
          pcVar7->regs_read[uVar8] = '+';
          break;
        }
        uVar8 = uVar8 + 1;
      } while (pcVar7->regs_read_count != uVar8);
    }
    pcVar7 = insn->detail;
    if ((ulong)pcVar7->regs_write_count != 0) {
      uVar8 = 0;
      do {
        if (pcVar7->regs_write[uVar8] == '\x1d') goto LAB_001aa7d5;
        uVar8 = uVar8 + 1;
      } while (pcVar7->regs_write_count != uVar8);
    }
  }
  else if (h->mode == CS_MODE_16) {
    pcVar7 = insn->detail;
    if ((ulong)pcVar7->regs_read_count != 0) {
      uVar8 = 0;
      do {
        if (pcVar7->regs_read[uVar8] == '\x17') {
          pcVar7->regs_read[uVar8] = '\x0e';
          break;
        }
        uVar8 = uVar8 + 1;
      } while (pcVar7->regs_read_count != uVar8);
    }
    pcVar7 = insn->detail;
    if ((ulong)pcVar7->regs_write_count != 0) {
      uVar8 = 0;
      do {
        if (pcVar7->regs_write[uVar8] == '\x17') {
          pcVar7->regs_write[uVar8] = '\x0e';
          break;
        }
        uVar8 = uVar8 + 1;
      } while (pcVar7->regs_write_count != uVar8);
    }
    pcVar7 = insn->detail;
    if ((ulong)pcVar7->regs_read_count != 0) {
      uVar8 = 0;
      do {
        if (pcVar7->regs_read[uVar8] == '\x1d') {
          pcVar7->regs_read[uVar8] = '-';
          break;
        }
        uVar8 = uVar8 + 1;
      } while (pcVar7->regs_read_count != uVar8);
    }
    pcVar7 = insn->detail;
    if ((ulong)pcVar7->regs_write_count != 0) {
      uVar8 = 0;
      do {
        if (pcVar7->regs_write[uVar8] == '\x1d') goto LAB_001aa7a7;
        uVar8 = uVar8 + 1;
      } while (pcVar7->regs_write_count != uVar8);
    }
  }
LAB_001aa7da:
  *(undefined8 *)insn->detail->groups = *(undefined8 *)insns[uVar5].groups;
  uVar6 = count_positive(insns[uVar5].groups);
  pcVar7 = insn->detail;
  pcVar7->groups_count = (uint8_t)uVar6;
  if ((insns[uVar5].branch != false) || (insns[uVar5].indirect_branch == true)) {
    pcVar7->groups[uVar6 & 0xff] = '\x01';
    puVar1 = &insn->detail->groups_count;
    *puVar1 = *puVar1 + '\x01';
  }
  uVar6 = insns[uVar5].id - 0x766;
  if (((uVar6 < 5) && ((0x15U >> (uVar6 & 0x1f) & 1) != 0)) &&
     (pcVar7 = insn->detail, *(long *)((long)&pcVar7->field_6 + 0x38) == -0x4e)) {
    pcVar7->groups[pcVar7->groups_count] = '\x04';
    puVar1 = &insn->detail->groups_count;
    *puVar1 = *puVar1 + '\x01';
  }
  return;
LAB_001aa7d5:
  pcVar7->regs_write[uVar8] = '+';
  goto LAB_001aa7da;
LAB_001aa7a7:
  pcVar7->regs_write[uVar8] = '-';
  goto LAB_001aa7da;
}

Assistant:

void X86_get_insn_id(cs_struct *h, cs_insn *insn, unsigned int id)
{
	int i = insn_find(insns, ARR_SIZE(insns), id, &h->insn_cache);
	if (i != 0) {
		insn->id = insns[i].mapid;

		if (h->detail) {
#ifndef CAPSTONE_DIET
			memcpy(insn->detail->regs_read, insns[i].regs_use, sizeof(insns[i].regs_use));
			insn->detail->regs_read_count = (uint8_t)count_positive(insns[i].regs_use);

			// special cases when regs_write[] depends on arch
			switch(id) {
				default:
					memcpy(insn->detail->regs_write, insns[i].regs_mod, sizeof(insns[i].regs_mod));
					insn->detail->regs_write_count = (uint8_t)count_positive(insns[i].regs_mod);
					break;
				case X86_RDTSC:
					if (h->mode == CS_MODE_64) {
						memcpy(insn->detail->regs_write, insns[i].regs_mod, sizeof(insns[i].regs_mod));
						insn->detail->regs_write_count = (uint8_t)count_positive(insns[i].regs_mod);
					} else {
						insn->detail->regs_write[0] = X86_REG_EAX;
						insn->detail->regs_write[1] = X86_REG_EDX;
						insn->detail->regs_write_count = 2;
					}
					break;
				case X86_RDTSCP:
					if (h->mode == CS_MODE_64) {
						memcpy(insn->detail->regs_write, insns[i].regs_mod, sizeof(insns[i].regs_mod));
						insn->detail->regs_write_count = (uint8_t)count_positive(insns[i].regs_mod);
					} else {
						insn->detail->regs_write[0] = X86_REG_EAX;
						insn->detail->regs_write[1] = X86_REG_ECX;
						insn->detail->regs_write[2] = X86_REG_EDX;
						insn->detail->regs_write_count = 3;
					}
					break;
			}

			switch(insn->id) {
				default:
					break;

				case X86_INS_LOOP:
				case X86_INS_LOOPE:
				case X86_INS_LOOPNE:
					switch(h->mode) {
						default: break;
						case CS_MODE_16:
								 insn->detail->regs_read[0] = X86_REG_CX;
								 insn->detail->regs_read_count = 1;
								 insn->detail->regs_write[0] = X86_REG_CX;
								 insn->detail->regs_write_count = 1;
								 break;
						case CS_MODE_32:
								 insn->detail->regs_read[0] = X86_REG_ECX;
								 insn->detail->regs_read_count = 1;
								 insn->detail->regs_write[0] = X86_REG_ECX;
								 insn->detail->regs_write_count = 1;
								 break;
						case CS_MODE_64:
								 insn->detail->regs_read[0] = X86_REG_RCX;
								 insn->detail->regs_read_count = 1;
								 insn->detail->regs_write[0] = X86_REG_RCX;
								 insn->detail->regs_write_count = 1;
								 break;
					}

					// LOOPE & LOOPNE also read EFLAGS
					if (insn->id != X86_INS_LOOP) {
						insn->detail->regs_read[1] = X86_REG_EFLAGS;
						insn->detail->regs_read_count = 2;
					}

					break;

				case X86_INS_LODSB:
				case X86_INS_LODSD:
				case X86_INS_LODSQ:
				case X86_INS_LODSW:
					switch(h->mode) {
						default:
							break;
						case CS_MODE_16:
							arr_replace(insn->detail->regs_read, insn->detail->regs_read_count, X86_REG_ESI, X86_REG_SI);
							arr_replace(insn->detail->regs_write, insn->detail->regs_write_count, X86_REG_ESI, X86_REG_SI);
							break;
						case CS_MODE_64:
							arr_replace(insn->detail->regs_read, insn->detail->regs_read_count, X86_REG_ESI, X86_REG_RSI);
							arr_replace(insn->detail->regs_write, insn->detail->regs_write_count, X86_REG_ESI, X86_REG_RSI);
							break;
					}
					break;

				case X86_INS_SCASB:
				case X86_INS_SCASW:
				case X86_INS_SCASQ:
				case X86_INS_STOSB:
				case X86_INS_STOSD:
				case X86_INS_STOSQ:
				case X86_INS_STOSW:
					switch(h->mode) {
						default:
							break;
						case CS_MODE_16:
							arr_replace(insn->detail->regs_read, insn->detail->regs_read_count, X86_REG_EDI, X86_REG_DI);
							arr_replace(insn->detail->regs_write, insn->detail->regs_write_count, X86_REG_EDI, X86_REG_DI);
							break;
						case CS_MODE_64:
							arr_replace(insn->detail->regs_read, insn->detail->regs_read_count, X86_REG_EDI, X86_REG_RDI);
							arr_replace(insn->detail->regs_write, insn->detail->regs_write_count, X86_REG_EDI, X86_REG_RDI);
							break;
					}
					break;

				case X86_INS_CMPSB:
				case X86_INS_CMPSD:
				case X86_INS_CMPSQ:
				case X86_INS_CMPSW:
				case X86_INS_MOVSB:
				case X86_INS_MOVSW:
				case X86_INS_MOVSD:
				case X86_INS_MOVSQ:
					switch(h->mode) {
						default:
							break;
						case CS_MODE_16:
							arr_replace(insn->detail->regs_read, insn->detail->regs_read_count, X86_REG_EDI, X86_REG_DI);
							arr_replace(insn->detail->regs_write, insn->detail->regs_write_count, X86_REG_EDI, X86_REG_DI);
							arr_replace(insn->detail->regs_read, insn->detail->regs_read_count, X86_REG_ESI, X86_REG_SI);
							arr_replace(insn->detail->regs_write, insn->detail->regs_write_count, X86_REG_ESI, X86_REG_SI);
							break;
						case CS_MODE_64:
							arr_replace(insn->detail->regs_read, insn->detail->regs_read_count, X86_REG_EDI, X86_REG_RDI);
							arr_replace(insn->detail->regs_write, insn->detail->regs_write_count, X86_REG_EDI, X86_REG_RDI);
							arr_replace(insn->detail->regs_read, insn->detail->regs_read_count, X86_REG_ESI, X86_REG_RSI);
							arr_replace(insn->detail->regs_write, insn->detail->regs_write_count, X86_REG_ESI, X86_REG_RSI);
							break;
					}
					break;
			}

			memcpy(insn->detail->groups, insns[i].groups, sizeof(insns[i].groups));
			insn->detail->groups_count = (uint8_t)count_positive(insns[i].groups);

			if (insns[i].branch || insns[i].indirect_branch) {
				// this insn also belongs to JUMP group. add JUMP group
				insn->detail->groups[insn->detail->groups_count] = X86_GRP_JUMP;
				insn->detail->groups_count++;
			}

			switch (insns[i].id) {
				case X86_OUT8ir:
				case X86_OUT16ir:
				case X86_OUT32ir:
					if (insn->detail->x86.operands[0].imm == -78) {
						// Writing to port 0xb2 causes an SMI on most platforms
						// See: http://cs.gmu.edu/~tr-admin/papers/GMU-CS-TR-2011-8.pdf
						insn->detail->groups[insn->detail->groups_count] = X86_GRP_INT;
						insn->detail->groups_count++;
					}
					break;

				default:
					break;
			}
#endif
		}
	}
}